

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

void __thiscall
Well<unsigned_int,32ul,17ul,23ul,13ul,11ul,10ul,Detail::M3<-13>,Detail::M3<-15>,Detail::M1,Detail::M2<-21>,Detail::M3<-13>,Detail::M2<1>,Detail::M0,Detail::M3<11>,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,17ul,23ul,13ul,11ul,10ul,Detail::M3<_13>,Detail::M3<_15>,Detail::M1,Detail::M2<_21>,Detail::M3<_13>,Detail::M2<1>,Detail::M0,Detail::M3<11>,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  uint *puVar1;
  invalid_argument *this_00;
  long lVar2;
  
  *(undefined8 *)(this + 0x48) = 0;
  puVar1 = *first;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x11) {
      return;
    }
    if (puVar1 == last) break;
    *(uint *)(this + lVar2 * 4) = *puVar1;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
    *first = puVar1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }